

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O0

size_t __thiscall
frozen::bits::pmh_tables<32ul,frozen::elsa<frozen::basic_string<char>>>::
lookup<frozen::basic_string<char>,frozen::elsa<frozen::basic_string<char>>>
          (pmh_tables<32ul,frozen::elsa<frozen::basic_string<char>>> *this,basic_string<char> *key,
          elsa<frozen::basic_string<char>_> *hasher)

{
  basic_string<char> value;
  value_type this_00;
  bool bVar1;
  size_t sVar2;
  const_reference pvVar3;
  value_type seed;
  const_reference pvVar4;
  seed_or_index local_30;
  value_type d;
  elsa<frozen::basic_string<char>_> *hasher_local;
  basic_string<char> *key_local;
  pmh_tables<32UL,_frozen::elsa<frozen::basic_string<char>_>_> *this_local;
  
  d.value_ = (value_type)hasher;
  sVar2 = elsa<frozen::basic_string<char>_>::operator()(hasher,*key,*(size_t *)this);
  pvVar3 = carray<frozen::bits::seed_or_index,_32UL>::operator[]
                     ((carray<frozen::bits::seed_or_index,_32UL> *)(this + 8),sVar2 & 0x1f);
  local_30.value_ = pvVar3->value_;
  bVar1 = seed_or_index::is_seed(&local_30);
  this_00 = d;
  if (bVar1) {
    value = *key;
    seed = seed_or_index::value(&local_30);
    sVar2 = elsa<frozen::basic_string<char>_>::operator()
                      ((elsa<frozen::basic_string<char>_> *)this_00.value_,value,seed);
    pvVar4 = carray<unsigned_long,_32UL>::operator[]
                       ((carray<unsigned_long,_32UL> *)(this + 0x108),sVar2 & 0x1f);
    this_local = (pmh_tables<32UL,_frozen::elsa<frozen::basic_string<char>_>_> *)*pvVar4;
  }
  else {
    this_local = (pmh_tables<32UL,_frozen::elsa<frozen::basic_string<char>_>_> *)
                 seed_or_index::value(&local_30);
  }
  return (size_t)this_local;
}

Assistant:

constexpr std::size_t lookup(const KeyType & key, const HasherType& hasher) const {
    auto const d = first_table_[hasher(key, static_cast<std::size_t>(first_seed_)) % M];
    if (!d.is_seed()) { return static_cast<std::size_t>(d.value()); } // this is narrowing std::uint64 -> std::size_t but should be fine
    else { return second_table_[hasher(key, static_cast<std::size_t>(d.value())) % M]; }
  }